

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::processQuery(CoreBroker *this,ActionMessage *message)

{
  ConnectionState CVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  string_view searchValue;
  string_view searchValue_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  string_view query;
  string_view query_00;
  string_view gidString;
  __type _Var2;
  bool bVar3;
  action_t aVar4;
  route_id rVar5;
  CoreBroker *this_00;
  pointer pBVar6;
  pointer pBVar7;
  ActionMessage *in_RSI;
  CoreBroker *in_RDI;
  string_view sVar8;
  string_view sVar9;
  ActionMessage queryResp_2;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  broker;
  string response;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  fed;
  route_id route;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *val;
  iterator __end7;
  iterator __begin7;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range7;
  json *json_1;
  JsonMapBuilder globalSet;
  json json;
  iterator gfind;
  ActionMessage queryResp_1;
  ActionMessage queryResp;
  string *target;
  bool force_ordered;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *in_stack_fffffffffffff5c8;
  ActionMessage *in_stack_fffffffffffff5d0;
  ActionMessage *in_stack_fffffffffffff5d8;
  int32_t *__args;
  undefined4 in_stack_fffffffffffff5e0;
  undefined4 in_stack_fffffffffffff5e4;
  undefined4 in_stack_fffffffffffff5e8;
  action_t in_stack_fffffffffffff5ec;
  GlobalFederateId in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f4;
  undefined4 in_stack_fffffffffffff5f8;
  undefined4 in_stack_fffffffffffff5fc;
  allocator<char> *in_stack_fffffffffffff600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff620;
  string *in_stack_fffffffffffff628;
  int iVar10;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff630;
  undefined7 in_stack_fffffffffffff638;
  undefined1 in_stack_fffffffffffff63f;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff640;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  *this_01;
  BasicBrokerInfo *in_stack_fffffffffffff678;
  undefined8 in_stack_fffffffffffff680;
  undefined7 in_stack_fffffffffffff688;
  undefined1 in_stack_fffffffffffff68f;
  size_t in_stack_fffffffffffff690;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  *this_02;
  char *in_stack_fffffffffffff698;
  ActionMessage *in_stack_fffffffffffff7d8;
  bool local_80d;
  allocator<char> local_7f1;
  string_view local_7f0;
  BaseType local_7bc;
  BaseType local_7b8;
  GlobalFederateId local_7b4;
  undefined1 local_7b0 [4];
  int32_t local_7ac;
  BaseType local_7a8;
  GlobalFederateId local_7a0 [43];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f1 [2];
  undefined4 local_6ac;
  string_view local_698;
  string local_681 [2];
  undefined1 local_639 [73];
  char *local_5f0;
  undefined4 local_5c8;
  GlobalFederateId local_5c4 [3];
  __sv_type local_5b8;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  local_5a8;
  allocator<char> local_599 [72];
  allocator<char> local_551 [65];
  string_view local_510;
  BaseType local_4e0;
  GlobalFederateId local_4dc;
  BasicFedInfo *local_4d8;
  __sv_type local_4b0;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_4a0;
  route_id local_498;
  BaseType local_494;
  BaseType local_490;
  allocator<char> local_489;
  string_view local_488;
  BaseType local_458;
  allocator<char> local_451 [145];
  reference local_3c0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_3b8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_3b0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_3a8;
  json *local_3a0;
  string_view local_348;
  undefined1 local_330 [48];
  string_view local_300;
  allocator<char> local_2b9;
  string_view local_2b8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_268;
  allocator<char> local_259;
  string_view local_258;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_228;
  BaseType local_220;
  GlobalFederateId local_21c;
  undefined1 local_218 [4];
  int32_t local_214;
  BaseType local_210;
  GlobalFederateId local_208 [43];
  BaseType local_15c;
  BaseType local_158;
  allocator<char> local_151;
  string_view local_150;
  BaseType local_120;
  string_view local_110;
  BaseType local_e0;
  GlobalFederateId local_dc;
  undefined1 local_d8 [4];
  int32_t local_d4;
  BaseType local_d0;
  GlobalFederateId local_c8 [42];
  CoreBroker *local_20;
  bool local_11;
  ActionMessage *local_10;
  
  local_10 = in_RSI;
  aVar4 = ActionMessage::action(in_RSI);
  local_80d = true;
  if (aVar4 != cmd_query_ordered) {
    aVar4 = ActionMessage::action(local_10);
    local_80d = aVar4 == cmd_broker_query_ordered;
  }
  local_11 = local_80d;
  this_00 = (CoreBroker *)
            ActionMessage::getString_abi_cxx11_
                      (in_stack_fffffffffffff5d8,(int)((ulong)in_stack_fffffffffffff5d0 >> 0x20));
  local_20 = this_00;
  getIdentifier_abi_cxx11_(in_RDI);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0.gid),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  if (((_Var2) ||
      (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff5d0,(char *)in_stack_fffffffffffff5c8), bVar3))
     || ((((in_RDI->super_BrokerBase).field_0x294 & 1) != 0 &&
         ((bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff5d0,(char *)in_stack_fffffffffffff5c8),
          bVar3 || (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_fffffffffffff5d0,
                                            (char *)in_stack_fffffffffffff5c8), bVar3)))))) {
    processLocalQuery(this_00,in_stack_fffffffffffff7d8);
    return;
  }
  if ((((in_RDI->super_BrokerBase).field_0x294 & 1) != 0) &&
     (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff5d0,(char *)in_stack_fffffffffffff5c8), bVar3))
  {
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0.gid),
               in_stack_fffffffffffff5ec);
    iVar10 = (int)((ulong)in_stack_fffffffffffff628 >> 0x20);
    local_c8[0].gid = (local_10->source_id).gid;
    local_e0 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
    GlobalFederateId::GlobalFederateId(&local_dc,(GlobalBrokerId)local_e0);
    local_d0 = local_dc.gid;
    local_d4 = local_10->messageID;
    local_110 = SmallBuffer::to_string((SmallBuffer *)0x5f3d8e);
    gidString._M_str = in_stack_fffffffffffff698;
    gidString._M_len = in_stack_fffffffffffff690;
    getNameList_abi_cxx11_
              ((CoreBroker *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),gidString
              );
    SmallBuffer::operator=
              ((SmallBuffer *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0.gid));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5d0);
    local_120 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
    bVar3 = GlobalFederateId::operator==(local_c8,(GlobalBrokerId)local_120);
    if (bVar3) {
      local_150 = SmallBuffer::to_string((SmallBuffer *)0x5f3e73);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffff610,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff608,
                 in_stack_fffffffffffff600);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::setDelayedValue(in_stack_fffffffffffff630,iVar10,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff620);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5d0);
      std::allocator<char>::~allocator(&local_151);
    }
    else {
      local_15c = local_c8[0].gid;
      local_158 = (BaseType)
                  getRoute((CoreBroker *)
                           CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
                           in_stack_fffffffffffff5f0);
      (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,(ulong)(uint)local_158,local_d8);
    }
    ActionMessage::~ActionMessage(in_stack_fffffffffffff5d0);
    return;
  }
  if ((((in_RDI->super_BrokerBase).field_0x294 & 1) != 0) &&
     ((bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff5d0,(char *)in_stack_fffffffffffff5c8), bVar3
      || (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff5d0,(char *)in_stack_fffffffffffff5c8),
         bVar3)))) {
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0.gid),
               in_stack_fffffffffffff5ec);
    local_208[0].gid = (local_10->source_id).gid;
    local_220 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
    GlobalFederateId::GlobalFederateId(&local_21c,(GlobalBrokerId)local_220);
    local_210 = local_21c.gid;
    local_214 = local_10->messageID;
    local_258 = SmallBuffer::to_string((SmallBuffer *)0x5f410b);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffff610,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff608,
               in_stack_fffffffffffff600);
    local_228._M_cur =
         (__node_type *)
         CLI::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff5c8,(key_type *)0x5f4186);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5d0);
    std::allocator<char>::~allocator(&local_259);
    local_268._M_cur =
         (__node_type *)
         CLI::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff5c8);
    bVar3 = CLI::std::__detail::operator==(&local_228,&local_268);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      local_300 = SmallBuffer::to_string((SmallBuffer *)0x5f4559);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (char *)in_stack_fffffffffffff5d8);
      __x._M_len._4_4_ = in_stack_fffffffffffff5fc;
      __x._M_len._0_4_ = in_stack_fffffffffffff5f8;
      __x._M_str = (char *)in_stack_fffffffffffff600;
      __y._M_len._4_4_ = in_stack_fffffffffffff5ec;
      __y._M_len._0_4_ = in_stack_fffffffffffff5e8;
      __y._M_str._0_4_ = in_stack_fffffffffffff5f0.gid;
      __y._M_str._4_4_ = in_stack_fffffffffffff5f4;
      bVar3 = std::operator==(__x,__y);
      if (bVar3) {
        generateStringVector<std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,helics::CoreBroker::processQuery(helics::ActionMessage&)::__0>
                  (local_330,&in_RDI->global_values);
        iVar10 = (int)((ulong)in_stack_fffffffffffff628 >> 0x20);
        SmallBuffer::operator=
                  ((SmallBuffer *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0.gid));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff5d0);
      }
      else {
        local_348 = SmallBuffer::to_string((SmallBuffer *)0x5f4648);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                   (char *)in_stack_fffffffffffff5d8);
        __x_00._M_len._4_4_ = in_stack_fffffffffffff5fc;
        __x_00._M_len._0_4_ = in_stack_fffffffffffff5f8;
        __x_00._M_str = (char *)in_stack_fffffffffffff600;
        __y_00._M_len._4_4_ = in_stack_fffffffffffff5ec;
        __y_00._M_len._0_4_ = in_stack_fffffffffffff5e8;
        __y_00._M_str._0_4_ = in_stack_fffffffffffff5f0.gid;
        __y_00._M_str._4_4_ = in_stack_fffffffffffff5f4;
        bVar3 = std::operator==(__x_00,__y_00);
        if (bVar3) {
          fileops::JsonMapBuilder::JsonMapBuilder((JsonMapBuilder *)in_stack_fffffffffffff5d0);
          local_3a0 = fileops::JsonMapBuilder::getJValue_abi_cxx11_
                                ((JsonMapBuilder *)in_stack_fffffffffffff5d0);
          local_3a8 = &in_RDI->global_values;
          local_3b0._M_cur =
               (__node_type *)
               CLI::std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff5c8);
          local_3b8._M_cur =
               (__node_type *)
               CLI::std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff5c8);
          while( true ) {
            bVar3 = CLI::std::__detail::operator==(&local_3b0,&local_3b8);
            iVar10 = (int)((ulong)in_stack_fffffffffffff628 >> 0x20);
            if (((bVar3 ^ 0xffU) & 1) == 0) break;
            local_3c0 = CLI::std::__detail::
                        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                        ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                     *)0x5f4765);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0.gid),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
            std::__cxx11::string::string(in_stack_fffffffffffff610,in_stack_fffffffffffff608);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::operator[](in_stack_fffffffffffff640,
                         (key_type *)CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638));
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffff5d8);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff5d0);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffff5d0);
            CLI::std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
            ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                          *)in_stack_fffffffffffff5d0);
          }
          fileops::JsonMapBuilder::generate_abi_cxx11_
                    ((JsonMapBuilder *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)
                    );
          SmallBuffer::operator=
                    ((SmallBuffer *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0.gid));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff5d0);
          fileops::JsonMapBuilder::~JsonMapBuilder((JsonMapBuilder *)in_stack_fffffffffffff5d0);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff610,(char *)in_stack_fffffffffffff608,
                     in_stack_fffffffffffff600);
          generateJsonErrorResponse
                    ((JsonErrorCodes)((ulong)in_stack_fffffffffffff630 >> 0x20),
                     in_stack_fffffffffffff628);
          iVar10 = (int)((ulong)in_stack_fffffffffffff628 >> 0x20);
          SmallBuffer::operator=
                    ((SmallBuffer *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0.gid));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff5d0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff5d0);
          std::allocator<char>::~allocator(local_451);
        }
      }
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff5d0,(char *)in_stack_fffffffffffff5c8);
      iVar10 = (int)((ulong)in_stack_fffffffffffff628 >> 0x20);
      if (bVar3) {
        CLI::std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
        ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                      *)0x5f4230);
        SmallBuffer::operator=
                  ((SmallBuffer *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0.gid));
      }
      else {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
        local_2b8 = SmallBuffer::to_string((SmallBuffer *)0x5f42cf);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (in_stack_fffffffffffff610,
                   (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff608,
                   in_stack_fffffffffffff600);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0.gid),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        ::operator[]<char_const>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffff5d8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffff5d0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff5d0);
        std::allocator<char>::~allocator(&local_2b9);
        CLI::std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
        ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                      *)0x5f43bb);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0.gid),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        ::operator[]<char_const>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffff5d8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffff5d0);
        fileops::generateJsonString
                  ((json *)in_stack_fffffffffffff5d8,
                   SUB81((ulong)in_stack_fffffffffffff5d0 >> 0x38,0));
        SmallBuffer::operator=
                  ((SmallBuffer *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0.gid));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff5d0);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffff5d0);
      }
    }
    local_458 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
    bVar3 = GlobalFederateId::operator==(local_208,(GlobalBrokerId)local_458);
    if (bVar3) {
      local_488 = SmallBuffer::to_string((SmallBuffer *)0x5f4a55);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffff610,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff608,
                 in_stack_fffffffffffff600);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::setDelayedValue(in_stack_fffffffffffff630,iVar10,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff620);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5d0);
      std::allocator<char>::~allocator(&local_489);
    }
    else {
      local_494 = local_208[0].gid;
      local_490 = (BaseType)
                  getRoute((CoreBroker *)
                           CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
                           in_stack_fffffffffffff5f0);
      (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,(ulong)(uint)local_490,local_218);
    }
    ActionMessage::~ActionMessage(in_stack_fffffffffffff5d0);
    return;
  }
  local_498.rid = 0;
  local_4b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff5d0);
  searchValue._M_len._4_4_ = in_stack_fffffffffffff5f4;
  searchValue._M_len._0_4_ = in_stack_fffffffffffff5f0.gid;
  searchValue._M_str._0_4_ = in_stack_fffffffffffff5f8;
  searchValue._M_str._4_4_ = in_stack_fffffffffffff5fc;
  local_4a0 = gmlc::containers::
              DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
              ::find((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                      *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),searchValue);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0));
  local_4d8 = (BasicFedInfo *)
              gmlc::containers::
              DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
              ::end((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                     *)in_stack_fffffffffffff5c8);
  bVar3 = __gnu_cxx::
          operator==<helics::BasicFedInfo_*,_const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                    ((__normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                      *)in_stack_fffffffffffff5d0,
                     (__normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                      *)in_stack_fffffffffffff5c8);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    local_5b8 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff5d0);
    searchValue_00._M_len._4_4_ = in_stack_fffffffffffff5f4;
    searchValue_00._M_len._0_4_ = in_stack_fffffffffffff5f0.gid;
    searchValue_00._M_str._0_4_ = in_stack_fffffffffffff5f8;
    searchValue_00._M_str._4_4_ = in_stack_fffffffffffff5fc;
    local_5a8 = gmlc::containers::
                DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                ::find((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                        *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
                       searchValue_00);
    local_5c4._4_8_ =
         gmlc::containers::
         DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
         ::end(in_stack_fffffffffffff5c8);
    bVar3 = __gnu_cxx::
            operator==<helics::BasicBrokerInfo_*,_const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                      ((__normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                        *)in_stack_fffffffffffff5d0,
                       (__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                        *)in_stack_fffffffffffff5c8);
    sVar8._M_str = (char *)in_stack_fffffffffffff618;
    sVar8._M_len = (size_t)in_stack_fffffffffffff620;
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      if (((in_RDI->super_BrokerBase).field_0x294 & 1) != 0) {
        sVar8 = SmallBuffer::to_string((SmallBuffer *)0x5f53b0);
        local_698 = sVar8;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                   (char *)in_stack_fffffffffffff5d8);
        __x_01._M_len._4_4_ = in_stack_fffffffffffff5fc;
        __x_01._M_len._0_4_ = in_stack_fffffffffffff5f8;
        __x_01._M_str = (char *)in_stack_fffffffffffff600;
        __y_01._M_len._4_4_ = in_stack_fffffffffffff5ec;
        __y_01._M_len._0_4_ = in_stack_fffffffffffff5e8;
        __y_01._M_str._0_4_ = in_stack_fffffffffffff5f0.gid;
        __y_01._M_str._4_4_ = in_stack_fffffffffffff5f4;
        bVar3 = std::operator==(__x_01,__y_01);
        if (bVar3) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffff5d0,(char *)in_stack_fffffffffffff5c8);
        }
      }
    }
    else {
      this_01 = &local_5a8;
      pBVar7 = __gnu_cxx::
               __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
               ::operator->(this_01);
      local_498.rid = (pBVar7->route).rid;
      pBVar7 = __gnu_cxx::
               __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
               ::operator->(this_01);
      local_5c8 = (pBVar7->global_id).gid;
      GlobalFederateId::GlobalFederateId(local_5c4,(GlobalBrokerId)local_5c8);
      (local_10->dest_id).gid = local_5c4[0].gid;
      __gnu_cxx::
      __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
      ::operator*(this_01);
      join_0x00000010_0x00000000_ = SmallBuffer::to_string((SmallBuffer *)0x5f50f2);
      query_00._M_str._0_7_ = in_stack_fffffffffffff688;
      query_00._M_len = in_stack_fffffffffffff680;
      query_00._M_str._7_1_ = in_stack_fffffffffffff68f;
      checkBrokerQuery_abi_cxx11_(in_stack_fffffffffffff678,query_00);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5d0);
      bVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5f517a);
      if (bVar3) {
        pBVar7 = __gnu_cxx::
                 __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                 ::operator->(&local_5a8);
        if (0x27 < pBVar7->state) {
          local_498.rid = 0;
          pBVar7 = __gnu_cxx::
                   __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                   ::operator->(&local_5a8);
          CVar1 = pBVar7->state;
          if (CVar1 == ERROR_STATE) {
            in_stack_fffffffffffff630 =
                 (DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_639;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff610,(char *)in_stack_fffffffffffff608,
                       in_stack_fffffffffffff600);
            generateJsonErrorResponse
                      ((JsonErrorCodes)((ulong)in_stack_fffffffffffff630 >> 0x20),
                       in_stack_fffffffffffff628);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff5d0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff5d0);
            std::allocator<char>::~allocator((allocator<char> *)local_639);
          }
          else if ((CVar1 == REQUEST_DISCONNECT) || (CVar1 == DISCONNECTED)) {
            in_stack_fffffffffffff628 = local_681;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff610,(char *)in_stack_fffffffffffff608,
                       in_stack_fffffffffffff600);
            generateJsonErrorResponse
                      ((JsonErrorCodes)((ulong)in_stack_fffffffffffff630 >> 0x20),
                       in_stack_fffffffffffff628);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff5d0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff5d0);
            std::allocator<char>::~allocator((allocator<char> *)local_681);
          }
        }
      }
      sVar8._M_str = (char *)in_stack_fffffffffffff618;
      sVar8._M_len = (size_t)in_stack_fffffffffffff620;
    }
  }
  else {
    this_02 = &local_4a0;
    pBVar6 = __gnu_cxx::
             __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
             ::operator->(this_02);
    local_498.rid = (pBVar6->route).rid;
    pBVar6 = __gnu_cxx::
             __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
             ::operator->(this_02);
    local_4e0 = (pBVar6->parent).gid;
    GlobalFederateId::GlobalFederateId(&local_4dc,(GlobalBrokerId)local_4e0);
    (local_10->dest_id).gid = local_4dc.gid;
    __gnu_cxx::
    __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
    ::operator*(this_02);
    local_510 = SmallBuffer::to_string((SmallBuffer *)0x5f4cfb);
    query._M_str._0_7_ = in_stack_fffffffffffff688;
    query._M_len = in_stack_fffffffffffff680;
    query._M_str._7_1_ = in_stack_fffffffffffff68f;
    checkFedQuery_abi_cxx11_((BasicFedInfo *)in_stack_fffffffffffff678,query);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5d0);
    bVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5f4d83);
    if (bVar3) {
      pBVar6 = __gnu_cxx::
               __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
               ::operator->(&local_4a0);
      if (0x27 < pBVar6->state) {
        local_498.rid = 0;
        pBVar6 = __gnu_cxx::
                 __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                 ::operator->(&local_4a0);
        CVar1 = pBVar6->state;
        if (CVar1 == ERROR_STATE) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff610,(char *)in_stack_fffffffffffff608,
                     in_stack_fffffffffffff600);
          generateJsonErrorResponse
                    ((JsonErrorCodes)((ulong)in_stack_fffffffffffff630 >> 0x20),
                     in_stack_fffffffffffff628);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff5d0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff5d0);
          std::allocator<char>::~allocator(local_551);
        }
        else if ((CVar1 == REQUEST_DISCONNECT) || (CVar1 == DISCONNECTED)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff610,(char *)in_stack_fffffffffffff608,
                     in_stack_fffffffffffff600);
          generateJsonErrorResponse
                    ((JsonErrorCodes)((ulong)in_stack_fffffffffffff630 >> 0x20),
                     in_stack_fffffffffffff628);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff5d0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff5d0);
          std::allocator<char>::~allocator(local_599);
        }
      }
    }
    sVar8._M_str = (char *)in_stack_fffffffffffff618;
    sVar8._M_len = (size_t)in_stack_fffffffffffff620;
  }
  local_6ac = 0;
  bVar3 = route_id::operator==(&local_498,(route_id)0x0);
  if ((!bVar3) || (((in_RDI->super_BrokerBase).field_0x294 & 1) == 0)) {
    bVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5f5476);
    if (bVar3) {
      bVar3 = GlobalFederateId::operator==
                        (&local_10->source_id,
                         (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
      if (bVar3) {
        bVar3 = std::
                deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                ::empty((deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                         *)0x5f5809);
        if (bVar3) {
          BrokerBase::setTickForwarding(&in_RDI->super_BrokerBase,QUERY_TIMEOUT,true);
        }
        in_stack_fffffffffffff5d0 = (ActionMessage *)&in_RDI->queryTimeouts;
        __args = &local_10->messageID;
        std::chrono::_V2::steady_clock::now();
        std::
        deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
        ::
        emplace_back<int&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                  ((deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),__args,
                   (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffff5d0);
      }
      (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,(ulong)(uint)local_498.rid,local_10);
      goto LAB_005f58af;
    }
  }
  bVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5f548b);
  if (bVar3) {
    in_stack_fffffffffffff610 = local_6f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff610,(char *)in_stack_fffffffffffff608,in_stack_fffffffffffff600
              );
    generateJsonErrorResponse
              ((JsonErrorCodes)((ulong)in_stack_fffffffffffff630 >> 0x20),in_stack_fffffffffffff628)
    ;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar8._M_len,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar8._M_str);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5d0);
    std::allocator<char>::~allocator((allocator<char> *)local_6f1);
  }
  iVar10 = (int)((ulong)in_stack_fffffffffffff628 >> 0x20);
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0.gid),
             in_stack_fffffffffffff5ec);
  local_7a0[0].gid = (local_10->source_id).gid;
  local_7b8 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
  GlobalFederateId::GlobalFederateId(&local_7b4,(GlobalBrokerId)local_7b8);
  local_7a8 = local_7b4.gid;
  local_7ac = local_10->messageID;
  SmallBuffer::operator=
            ((SmallBuffer *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0.gid));
  local_7bc = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
  bVar3 = GlobalFederateId::operator==(local_7a0,(GlobalBrokerId)local_7bc);
  if (bVar3) {
    sVar9 = SmallBuffer::to_string((SmallBuffer *)0x5f565a);
    local_7f0 = sVar9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffff610,
               (basic_string_view<char,_std::char_traits<char>_> *)sVar9._M_len,
               (allocator<char> *)sVar9._M_str);
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::setDelayedValue(in_stack_fffffffffffff630,iVar10,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      sVar8._M_len);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5d0);
    std::allocator<char>::~allocator(&local_7f1);
  }
  else {
    rVar5 = getRoute((CoreBroker *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
                     in_stack_fffffffffffff5f0);
    (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,(ulong)(uint)rVar5.rid,local_7b0);
  }
  ActionMessage::~ActionMessage(in_stack_fffffffffffff5d0);
LAB_005f58af:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d0);
  return;
}

Assistant:

void CoreBroker::processQuery(ActionMessage& message)
{
    const bool force_ordered =
        (message.action() == CMD_QUERY_ORDERED || message.action() == CMD_BROKER_QUERY_ORDERED);
    const auto& target = message.getString(targetStringLoc);
    if ((target == getIdentifier() || target == "broker") ||
        (isRootc && (target == "root" || target == "federation"))) {
        processLocalQuery(message);
    } else if (isRootc && target == "gid_to_name") {
        ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
        queryResp.dest_id = message.source_id;
        queryResp.source_id = global_broker_id_local;
        queryResp.messageID = message.messageID;
        queryResp.payload = getNameList(message.payload.to_string());
        if (queryResp.dest_id == global_broker_id_local) {
            activeQueries.setDelayedValue(message.messageID,
                                          std::string(queryResp.payload.to_string()));
        } else {
            transmit(getRoute(queryResp.dest_id), queryResp);
        }
    } else if ((isRootc) && (target == "global" || target == "global_value")) {
        ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
        queryResp.dest_id = message.source_id;
        queryResp.source_id = global_broker_id_local;
        queryResp.messageID = message.messageID;

        auto gfind = global_values.find(std::string(message.payload.to_string()));
        if (gfind != global_values.end()) {
            if (target == "global_value") {
                queryResp.payload = gfind->second;
            } else {
                nlohmann::json json;
                json["name"] = std::string(message.payload.to_string());
                json["value"] = gfind->second;
                queryResp.payload = fileops::generateJsonString(json);
            }
        } else if (message.payload.to_string() == "list") {
            queryResp.payload = generateStringVector(global_values, [](const auto& globalValue) {
                return globalValue.first;
            });
        } else if (message.payload.to_string() == "all") {
            fileops::JsonMapBuilder globalSet;
            auto& json = globalSet.getJValue();
            for (auto& val : global_values) {
                json[val.first] = val.second;
            }
            queryResp.payload = globalSet.generate();
        } else {
            queryResp.payload =
                generateJsonErrorResponse(JsonErrorCodes::NOT_FOUND, "Global value not found");
        }
        if (queryResp.dest_id == global_broker_id_local) {
            activeQueries.setDelayedValue(message.messageID,
                                          std::string(queryResp.payload.to_string()));
        } else {
            transmit(getRoute(queryResp.dest_id), queryResp);
        }
    } else {
        route_id route = parent_route_id;
        auto fed = mFederates.find(target);
        std::string response;
        if (fed != mFederates.end()) {
            route = fed->route;
            message.dest_id = fed->parent;
            response = checkFedQuery(*fed, message.payload.to_string());
            if (response.empty() && fed->state >= ConnectionState::ERROR_STATE) {
                route = parent_route_id;
                switch (fed->state) {
                    case ConnectionState::ERROR_STATE:
                        response = generateJsonErrorResponse(JsonErrorCodes::SERVICE_UNAVAILABLE,
                                                             "federate is in error state");
                        break;
                    case ConnectionState::DISCONNECTED:
                    case ConnectionState::REQUEST_DISCONNECT:
                        response = generateJsonErrorResponse(JsonErrorCodes::SERVICE_UNAVAILABLE,
                                                             "federate is disconnected");
                        break;
                    default:
                        break;
                }
            }
        } else {
            auto broker = mBrokers.find(target);
            if (broker != mBrokers.end()) {
                route = broker->route;
                message.dest_id = broker->global_id;
                response = checkBrokerQuery(*broker, message.payload.to_string());
                if (response.empty() && broker->state >= ConnectionState::ERROR_STATE) {
                    route = parent_route_id;
                    switch (broker->state) {
                        case ConnectionState::ERROR_STATE:
                            response =
                                generateJsonErrorResponse(JsonErrorCodes::SERVICE_UNAVAILABLE,
                                                          "target broker is in error state");
                            break;
                        case ConnectionState::DISCONNECTED:
                        case ConnectionState::REQUEST_DISCONNECT:
                            response =
                                generateJsonErrorResponse(JsonErrorCodes::SERVICE_UNAVAILABLE,
                                                          "federate is disconnected");
                            break;
                        default:
                            break;
                    }
                }
            } else if (isRootc && message.payload.to_string() == "exists") {
                response = "false";
            }
        }
        if (((route == parent_route_id) && (isRootc)) || !response.empty()) {
            if (response.empty()) {
                response = generateJsonErrorResponse(JsonErrorCodes::NOT_FOUND, "query not valid");
            }
            ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
            queryResp.dest_id = message.source_id;
            queryResp.source_id = global_broker_id_local;
            queryResp.messageID = message.messageID;

            queryResp.payload = response;
            if (queryResp.dest_id == global_broker_id_local) {
                activeQueries.setDelayedValue(message.messageID,
                                              std::string(queryResp.payload.to_string()));
            } else {
                transmit(getRoute(queryResp.dest_id), queryResp);
            }
        } else {
            if (message.source_id == global_broker_id_local) {
                if (queryTimeouts.empty()) {
                    setTickForwarding(TickForwardingReasons::QUERY_TIMEOUT, true);
                }
                queryTimeouts.emplace_back(message.messageID, std::chrono::steady_clock::now());
            }
            transmit(route, message);
        }
    }
}